

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

void xmrig::HttpContext::attach(http_parser_settings *settings)

{
  _func_int_http_parser_ptr_char_ptr_size_t *p_Var1;
  _func_int_http_parser_ptr *p_Var2;
  undefined8 *in_RDI;
  __3 local_c;
  __2 local_b;
  __1 local_a;
  __0 local_9;
  undefined8 *local_8;
  
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  local_8 = in_RDI;
  p_Var1 = attach(http_parser_settings*)::$_0::operator_cast_to_function_pointer(&local_9);
  local_8[1] = p_Var1;
  local_8[3] = onHeaderField;
  local_8[4] = onHeaderValue;
  p_Var2 = attach(http_parser_settings*)::$_1::operator_cast_to_function_pointer(&local_a);
  local_8[5] = p_Var2;
  p_Var1 = attach(http_parser_settings*)::$_2::operator_cast_to_function_pointer(&local_b);
  local_8[6] = p_Var1;
  p_Var2 = attach(http_parser_settings*)::$_3::operator_cast_to_function_pointer(&local_c);
  local_8[7] = p_Var2;
  return;
}

Assistant:

void xmrig::HttpContext::attach(http_parser_settings *settings)
{
    settings->on_message_begin  = nullptr;
    settings->on_status         = nullptr;
    settings->on_chunk_header   = nullptr;
    settings->on_chunk_complete = nullptr;

    settings->on_url = [](http_parser *parser, const char *at, size_t length) -> int
    {
        static_cast<HttpContext*>(parser->data)->url = std::string(at, length);
        return 0;
    };

    settings->on_header_field = onHeaderField;
    settings->on_header_value = onHeaderValue;

    settings->on_headers_complete = [](http_parser* parser) -> int {
        auto ctx = static_cast<HttpContext*>(parser->data);
        ctx->status = parser->status_code;

        if (parser->type == HTTP_REQUEST) {
            ctx->method = parser->method;
        }

        if (!ctx->m_lastHeaderField.empty()) {
            ctx->setHeader();
        }

        return 0;
    };

    settings->on_body = [](http_parser *parser, const char *at, size_t len) -> int
    {
        static_cast<HttpContext*>(parser->data)->body += std::string(at, len);

        return 0;
    };

    settings->on_message_complete = [](http_parser *parser) -> int
    {
        auto ctx = static_cast<HttpContext*>(parser->data);
        ctx->m_listener->onHttpData(*ctx);
        ctx->m_listener = nullptr;

        return 0;
    };
}